

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
::erase(btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
        *this,iterator iter)

{
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  bVar1;
  int iVar2;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *pbVar3;
  iterator iVar4;
  iterator iVar5;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  local_48;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  local_38;
  
  pbVar3 = iter.node;
  iVar2 = iter.position;
  local_48.node = pbVar3;
  local_48.position = iVar2;
  if (((undefined1  [16])iter & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    bVar1 = pbVar3[0xb];
    if (bVar1 == (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                  )0x0) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
      ::decrement(&local_48);
      if (((ulong)local_48.node & 7) != 0) goto LAB_00201e71;
      if (local_48.node[0xb] ==
          (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
           )0x0) {
        __assert_fail("iter.node->leaf()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xa7e,
                      "iterator phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::erase(iterator) [Params = phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
                     );
      }
      *(undefined4 *)(pbVar3 + (long)iVar2 * 8 + 0xc) =
           *(undefined4 *)(local_48.node + (long)local_48.position * 8 + 0xc);
      *(undefined4 *)(pbVar3 + (long)iVar2 * 8 + 0x10) =
           *(undefined4 *)(local_48.node + (long)local_48.position * 8 + 0x10);
    }
    btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
    ::remove_value(local_48.node,local_48.position,(allocator_type *)this);
    this->size_ = this->size_ - 1;
    iVar4.position = local_48.position;
    iVar4.node = local_48.node;
    iVar4._12_4_ = 0;
    iVar4 = rebalance_after_delete(this,iVar4);
    local_38.node = iVar4.node;
    local_38.position = iVar4.position;
    if (bVar1 == (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                  )0x0) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
      ::increment(&local_38);
    }
    iVar5.position = local_38.position;
    iVar5.node = local_38.node;
    iVar5._12_4_ = 0;
    return iVar5;
  }
LAB_00201e71:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

auto btree<P>::erase(iterator iter) -> iterator {
        bool internal_delete = false;
        if (!iter.node->leaf()) {
            // Deletion of a value on an internal node. First, move the largest value
            // from our left child here, then delete that position (in remove_value()
            // below). We can get to the largest value from our left child by
            // decrementing iter.
            iterator internal_iter(iter);
            --iter;
            assert(iter.node->leaf());
            params_type::move(mutable_allocator(), iter.node->slot(iter.position),
                              internal_iter.node->slot(internal_iter.position));
            internal_delete = true;
        }

        // Delete the key from the leaf.
        iter.node->remove_value(iter.position, mutable_allocator());
        --size_;

        // We want to return the next value after the one we just erased. If we
        // erased from an internal node (internal_delete == true), then the next
        // value is ++(++iter). If we erased from a leaf node (internal_delete ==
        // false) then the next value is ++iter. Note that ++iter may point to an
        // internal node and the value in the internal node may move to a leaf node
        // (iter.node) when rebalancing is performed at the leaf level.

        iterator res = rebalance_after_delete(iter);

        // If we erased from an internal node, advance the iterator.
        if (internal_delete) {
            ++res;
        }
        return res;
    }